

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O1

void __thiscall
VW::config::options_boost_po::
add_to_description_impl<VW::config::typelist<int,unsigned_long,unsigned_long,float,double,char,std::__cxx11::string,bool,std::vector<int,std::allocator<int>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<char,std::allocator<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (options_boost_po *this,shared_ptr<VW::config::base_option> *opt,
          options_description *options_description)

{
  bool bVar1;
  shared_ptr<VW::config::base_option> local_40;
  shared_ptr<VW::config::base_option> local_30;
  
  local_30.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
  if (local_30.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_30.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_30.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar1 = add_if_t<int>(this,&local_30,options_description);
  if (local_30.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (!bVar1) {
    local_40.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_40.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_40.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_40.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_40.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    add_to_description_impl<VW::config::typelist<unsigned_long,unsigned_long,float,double,char,std::__cxx11::string,bool,std::vector<int,std::allocator<int>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<char,std::allocator<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (this,&local_40,options_description);
    if (local_40.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void add_to_description_impl(std::shared_ptr<base_option> opt, po::options_description& options_description)
  {
    if (add_if_t<typename TTypes::head>(opt, options_description))
    {
      return;
    }
    add_to_description_impl<typename TTypes::tail>(opt, options_description);
  }